

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppLayout.cpp
# Opt level: O2

IWindowPtr __thiscall cursespp::AppLayout::BlurShortcuts(AppLayout *this)

{
  char cVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  long *in_RSI;
  long *plVar3;
  IWindowPtr IVar4;
  __shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2> local_50;
  undefined1 local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  (**(code **)(*(long *)in_RSI[0x4c] + 0x160))();
  (**(code **)(*(long *)in_RSI[0x4c] + 0x40))();
  plVar3 = (long *)in_RSI[0x4e];
  if (plVar3 != (long *)0x0) {
    if (in_RSI[0x52] != 0) {
      std::__shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_50,
                 (__shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0x52));
      cVar1 = (**(code **)(*plVar3 + 0x1d8))(plVar3,&local_50);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
      std::__shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>::reset
                ((__shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0x52));
      if (cVar1 != '\0') goto LAB_00173964;
      plVar3 = (long *)in_RSI[0x4e];
    }
    (**(code **)(*plVar3 + 0x210))(local_40,plVar3);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  }
LAB_00173964:
  (**(code **)(*in_RSI + 0x220))();
  if ((long *)in_RSI[0x4e] == (long *)0x0) {
    (this->super_LayoutBase).super_Window.super_IWindow.super_IOrderable._vptr_IOrderable =
         (_func_int **)0x0;
    (this->super_LayoutBase).super_Window.super_IWindow.super_IDisplayable._vptr_IDisplayable =
         (_func_int **)0x0;
    _Var2._M_pi = extraout_RDX;
  }
  else {
    (**(code **)(*(long *)in_RSI[0x4e] + 0x1d0))(this);
    _Var2._M_pi = extraout_RDX_00;
  }
  IVar4.super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  IVar4.super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (IWindowPtr)IVar4.super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

cursespp::IWindowPtr AppLayout::BlurShortcuts() {
    this->shortcuts->Hide();
    this->shortcuts->Blur();

    if (this->layout) {
        bool refocused = false;
        if (this->lastFocus) {
            refocused = this->layout->SetFocus(this->lastFocus);
            this->lastFocus.reset();
        }

        if (!refocused) {
            this->layout->FocusFirst();
        }
    }

    this->Layout();
    return this->layout ? this->layout->GetFocus() : IWindowPtr();
}